

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>_>_>
::resize(raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>_>_>
         *this,size_t new_capacity)

{
  ctrl_t *p;
  slot_type *pptVar1;
  size_t capacity;
  size_t hashval;
  size_t sVar2;
  FindInfo FVar3;
  Layout LVar4;
  tuple<unsigned_long,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>_>_>
  *local_48;
  _Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  local_40;
  _Head_base<0UL,_const_phmap::priv::Tracked<int>_&,_false> local_38;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    p = this->ctrl_;
    pptVar1 = this->slots_;
    capacity = this->capacity_;
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
    if (capacity != 0) {
      sVar2 = 0;
      do {
        if (-1 < p[sVar2]) {
          local_40._M_head_impl = &pptVar1[sVar2]->first;
          local_38._M_head_impl = &((slot_type)local_40._M_head_impl)->second;
          local_48 = &this->settings_;
          hashval = raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::string,phmap::priv::Tracked<int>>,phmap::priv::StringHashEqT<char>::Hash,phmap::priv::StringHashEqT<char>::Eq,std::allocator<std::pair<std::__cxx11::string_const,phmap::priv::Tracked<int>>>>
                    ::HashElement::operator()
                              ((HashElement *)&local_48,local_40._M_head_impl,
                               (piecewise_construct_t *)&std::piecewise_construct,
                               (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                *)&local_40,(tuple<const_phmap::priv::Tracked<int>_&> *)&local_38);
          FVar3 = find_first_non_full(this,hashval);
          set_ctrl(this,FVar3.offset,(byte)hashval & 0x7f);
          this->slots_[FVar3.offset] = pptVar1[sVar2];
        }
        sVar2 = sVar2 + 1;
      } while (capacity != sVar2);
      LVar4 = MakeLayout(capacity);
      Deallocate<8ul,std::allocator<std::pair<std::__cxx11::string_const,phmap::priv::Tracked<int>>>>
                ((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>_>
                  *)&this->settings_,p,
                 (LVar4.
                  super_LayoutType<sizeof___(Ts),_signed_char,_std::pair<const_std::__cxx11::basic_string<char>,_phmap::priv::Tracked<int>_>_*>
                  .size_[0] + 7 & 0xfffffffffffffff8) +
                 LVar4.
                 super_LayoutType<sizeof___(Ts),_signed_char,_std::pair<const_std::__cxx11::basic_string<char>,_phmap::priv::Tracked<int>_>_*>
                 .size_[1] * 8);
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x807,
                "void phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<std::basic_string<char>, phmap::priv::Tracked<int>>, phmap::priv::StringHashEqT<char>::Hash, phmap::priv::StringHashEqT<char>::Eq, std::allocator<std::pair<const std::basic_string<char>, phmap::priv::Tracked<int>>>>::resize(size_t) [Policy = phmap::priv::NodeHashMapPolicy<std::basic_string<char>, phmap::priv::Tracked<int>>, Hash = phmap::priv::StringHashEqT<char>::Hash, Eq = phmap::priv::StringHashEqT<char>::Eq, Alloc = std::allocator<std::pair<const std::basic_string<char>, phmap::priv::Tracked<int>>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }